

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  long lVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 *puVar14;
  bool bVar15;
  undefined8 uVar9;
  
  iVar7 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar8 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])(other);
  bVar15 = true;
  if (CONCAT44(extraout_var,iVar7) == CONCAT44(extraout_var_00,iVar8)) {
    ppCVar2 = (this->m_list).
              super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar10 = (long)(this->m_list).
                   super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2;
    bVar15 = lVar10 != 0;
    if (bVar15) {
      uVar11 = lVar10 >> 3;
      ppCVar3 = (other->m_list).
                super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(other->m_list).
                     super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3;
      uVar13 = 1;
      do {
        if (uVar13 - lVar10 == 1) {
          pcVar12 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          uVar9 = ::std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,lVar10);
          uVar6 = (undefined1)uVar9;
          puVar4 = *(undefined8 **)pcVar12;
          puVar5 = *(undefined8 **)((long)pcVar12 + 8);
          puVar14 = puVar4;
          if (puVar5 != puVar4) {
            do {
              if ((undefined8 *)*puVar14 != puVar14 + 2) {
                operator_delete((undefined8 *)*puVar14);
                uVar9 = extraout_RAX;
              }
              uVar6 = (undefined1)uVar9;
              puVar14 = puVar14 + 4;
            } while (puVar14 != puVar5);
            *(undefined8 **)((long)pcVar12 + 8) = puVar4;
          }
          return (bool)uVar6;
        }
        if (ppCVar2[uVar13 - 1] != ppCVar3[uVar13 - 1]) {
          return bVar15;
        }
        bVar15 = uVar13 < uVar11;
        lVar1 = (-(ulong)(uVar11 == 0) - uVar11) + uVar13;
        uVar13 = uVar13 + 1;
      } while (lVar1 != 0);
    }
  }
  return bVar15;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }